

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

void libtorrent::aux::parse_comma_separated_string
               (string *in,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  byte bVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(out,*(pointer *)out);
  uVar4 = in->_M_string_length;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      uVar3 = uVar5 + 1;
      if (uVar5 + 1 < uVar4) {
        uVar3 = uVar4;
      }
      do {
        bVar1 = (in->_M_dataplus)._M_p[uVar5];
        if ((4 < bVar1 - 9) && (uVar6 = uVar5, bVar1 != 0x20)) break;
        uVar5 = uVar5 + 1;
        uVar6 = uVar3;
      } while (uVar5 < uVar4);
      sVar2 = ::std::__cxx11::string::find((char)in,0x2c);
      if (sVar2 == 0xffffffffffffffff) {
        sVar2 = in->_M_string_length;
      }
      if (uVar6 < sVar2) {
        uVar4 = sVar2;
        do {
          bVar1 = (in->_M_dataplus)._M_p[uVar4 - 1];
          if ((4 < bVar1 - 9) && (bVar1 != 0x20)) break;
          uVar4 = uVar4 - 1;
        } while (uVar6 < uVar4);
      }
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)in);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,&local_50)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar5 = sVar2 + 1;
      uVar4 = in->_M_string_length;
    } while (uVar5 < uVar4);
  }
  return;
}

Assistant:

void parse_comma_separated_string(std::string const& in, std::vector<std::string>& out)
	{
		out.clear();

		std::string::size_type start = 0;
		std::string::size_type end = 0;

		while (start < in.size())
		{
			// skip leading spaces
			while (start < in.size()
				&& is_space(in[start]))
				++start;

			end = in.find_first_of(',', start);
			if (end == std::string::npos) end = in.size();

			// skip trailing spaces
			std::string::size_type soft_end = end;
			while (soft_end > start
				&& is_space(in[soft_end - 1]))
				--soft_end;

			out.push_back(in.substr(start, soft_end - start));
			start = end + 1;
		}
	}